

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEdge.c
# Opt level: O1

void Gia_ManConvertPackingToEdges(Gia_Man_t *p)

{
  int iVar1;
  uint uVar2;
  Vec_Int_t *pVVar3;
  int *piVar4;
  int *piVar5;
  Vec_Int_t *pVVar6;
  int *piVar7;
  Vec_Int_t *pVVar8;
  int *__s;
  int iVar9;
  int iVar10;
  int iVar11;
  uint *puVar12;
  uint uVar13;
  uint uVar14;
  long lVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  ulong uVar19;
  uint *puVar20;
  int nNodes [4];
  uint local_48 [6];
  
  if (p->vPacking != (Vec_Int_t *)0x0) {
    if (p->vEdge1 != (Vec_Int_t *)0x0) {
      piVar7 = p->vEdge1->pArray;
      if (piVar7 != (int *)0x0) {
        free(piVar7);
        p->vEdge1->pArray = (int *)0x0;
      }
      if (p->vEdge1 != (Vec_Int_t *)0x0) {
        free(p->vEdge1);
        p->vEdge1 = (Vec_Int_t *)0x0;
      }
    }
    if (p->vEdge2 != (Vec_Int_t *)0x0) {
      piVar7 = p->vEdge2->pArray;
      if (piVar7 != (int *)0x0) {
        free(piVar7);
        p->vEdge2->pArray = (int *)0x0;
      }
      if (p->vEdge2 != (Vec_Int_t *)0x0) {
        free(p->vEdge2);
        p->vEdge2 = (Vec_Int_t *)0x0;
      }
    }
    iVar1 = p->nObjs;
    pVVar6 = (Vec_Int_t *)malloc(0x10);
    iVar17 = 0x10;
    if (0xe < iVar1 - 1U) {
      iVar17 = iVar1;
    }
    pVVar6->nSize = 0;
    pVVar6->nCap = iVar17;
    if (iVar17 == 0) {
      piVar7 = (int *)0x0;
    }
    else {
      piVar7 = (int *)malloc((long)iVar17 * 4);
    }
    pVVar6->pArray = piVar7;
    pVVar6->nSize = iVar1;
    if (piVar7 != (int *)0x0) {
      memset(piVar7,0,(long)iVar1 * 4);
    }
    p->vEdge1 = pVVar6;
    pVVar8 = (Vec_Int_t *)malloc(0x10);
    pVVar8->nSize = 0;
    pVVar8->nCap = iVar17;
    if (iVar17 == 0) {
      __s = (int *)0x0;
    }
    else {
      __s = (int *)malloc((long)iVar17 << 2);
    }
    pVVar8->pArray = __s;
    pVVar8->nSize = iVar1;
    if (__s != (int *)0x0) {
      memset(__s,0,(long)iVar1 << 2);
    }
    p->vEdge2 = pVVar8;
    pVVar3 = p->vPacking;
    if (pVVar3->nSize < 1) {
LAB_001f71fa:
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                    ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
    }
    piVar4 = pVVar3->pArray;
    iVar1 = *piVar4;
    iVar17 = pVVar3->nSize;
    iVar10 = 0;
    iVar16 = 0;
    if (1 < iVar17) {
      uVar13 = 1;
      iVar16 = 0;
      iVar10 = 0;
      do {
        if ((int)uVar13 < 0) goto LAB_001f71fa;
        uVar2 = piVar4[uVar13];
        if (2 < uVar2 - 1) {
          __assert_fail("Entry > 0 && Entry < 4",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaEdge.c"
                        ,0x84,"void Gia_ManConvertPackingToEdges(Gia_Man_t *)");
        }
        uVar14 = uVar13 + 1;
        if (0 < (int)uVar2) {
          uVar19 = 0;
          do {
            if (iVar17 <= (int)(uVar14 + (int)uVar19)) goto LAB_001f71fa;
            local_48[uVar19] = piVar4[(ulong)uVar13 + uVar19 + 1];
            uVar19 = uVar19 + 1;
          } while (uVar2 != uVar19);
          uVar14 = uVar14 + (int)uVar19;
        }
        uVar13 = uVar14;
        if ((ulong)uVar2 == 3) {
          lVar15 = (long)(int)local_48[0];
          if ((lVar15 < 0) || (pVVar6->nSize <= (int)local_48[0])) goto LAB_001f71fa;
          uVar19 = (ulong)local_48[2];
          piVar5 = piVar7;
          if (piVar7[lVar15] == 0) {
LAB_001f70e0:
            piVar5[lVar15] = local_48[2];
            iVar17 = 0;
          }
          else {
            if (pVVar8->nSize <= (int)local_48[0]) goto LAB_001f71fa;
            iVar17 = 1;
            piVar5 = __s;
            if (__s[lVar15] == 0) goto LAB_001f70e0;
          }
          if (((int)local_48[2] < 0) || (pVVar6->nSize <= (int)local_48[2])) goto LAB_001f71fa;
          puVar20 = (uint *)(piVar7 + uVar19);
          puVar12 = puVar20;
          if (*puVar20 == 0) {
LAB_001f7121:
            *puVar12 = local_48[0];
            iVar9 = 0;
          }
          else {
            if (pVVar8->nSize <= (int)local_48[2]) goto LAB_001f71fa;
            iVar9 = 1;
            if (__s[uVar19] == 0) {
              puVar12 = (uint *)(__s + uVar19);
              goto LAB_001f7121;
            }
          }
          lVar15 = (long)(int)local_48[1];
          if ((lVar15 < 0) || (pVVar6->nSize <= (int)local_48[1])) goto LAB_001f71fa;
          piVar5 = piVar7;
          if (piVar7[lVar15] == 0) {
LAB_001f7177:
            piVar5[lVar15] = local_48[2];
            iVar11 = 0;
          }
          else {
            if (pVVar8->nSize <= (int)local_48[1]) goto LAB_001f71fa;
            iVar11 = 1;
            piVar5 = __s;
            if (__s[lVar15] == 0) goto LAB_001f7177;
          }
          if (pVVar6->nSize <= (int)local_48[2]) goto LAB_001f71fa;
          if (*puVar20 == 0) {
LAB_001f71a1:
            *puVar20 = local_48[1];
            iVar18 = 0;
          }
          else {
            if (pVVar8->nSize <= (int)local_48[2]) goto LAB_001f71fa;
            iVar18 = 1;
            if (__s[uVar19] == 0) {
              puVar20 = (uint *)(__s + uVar19);
              goto LAB_001f71a1;
            }
          }
          iVar16 = iVar17 + iVar16 + iVar9 + iVar11 + iVar18;
        }
        else if (uVar2 == 2) {
          lVar15 = (long)(int)local_48[0];
          if ((lVar15 < 0) || (pVVar6->nSize <= (int)local_48[0])) goto LAB_001f71fa;
          uVar19 = (ulong)local_48[1];
          piVar5 = piVar7;
          if (piVar7[lVar15] == 0) {
LAB_001f7096:
            piVar5[lVar15] = local_48[1];
            iVar17 = 0;
          }
          else {
            if (pVVar8->nSize <= (int)local_48[0]) goto LAB_001f71fa;
            iVar17 = 1;
            piVar5 = __s;
            if (__s[lVar15] == 0) goto LAB_001f7096;
          }
          if (((int)local_48[1] < 0) || (pVVar6->nSize <= (int)local_48[1])) goto LAB_001f71fa;
          piVar5 = piVar7;
          if (piVar7[uVar19] == 0) {
LAB_001f7165:
            piVar5[uVar19] = local_48[0];
            iVar9 = 0;
          }
          else {
            if (pVVar8->nSize <= (int)local_48[1]) goto LAB_001f71fa;
            iVar9 = 1;
            piVar5 = __s;
            if (__s[uVar19] == 0) goto LAB_001f7165;
          }
          iVar16 = iVar17 + iVar16 + iVar9;
        }
        iVar10 = iVar10 + 1;
        iVar17 = pVVar3->nSize;
      } while ((int)uVar13 < iVar17);
    }
    if (iVar1 != iVar10) {
      __assert_fail("nEntries == nEntries2",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaEdge.c"
                    ,0x98,"void Gia_ManConvertPackingToEdges(Gia_Man_t *)");
    }
    if (iVar16 != 0) {
      printf("Skipped %d illegal edges.\n");
      return;
    }
  }
  return;
}

Assistant:

void Gia_ManConvertPackingToEdges( Gia_Man_t * p )
{
    int i, k, Entry, nEntries, nEntries2, nNodes[4], Count = 0;
    if ( p->vPacking == NULL )
        return;
    Vec_IntFreeP( &p->vEdge1 );
    Vec_IntFreeP( &p->vEdge2 );
    p->vEdge1 = Vec_IntStart( Gia_ManObjNum(p) );
    p->vEdge2 = Vec_IntStart( Gia_ManObjNum(p) );
    // iterate through structures
    nEntries = Vec_IntEntry( p->vPacking, 0 );
    nEntries2 = 0;
    Vec_IntForEachEntryStart( p->vPacking, Entry, i, 1 )
    {
        assert( Entry > 0 && Entry < 4 );
        i++;
        for ( k = 0; k < Entry; k++, i++ )
            nNodes[k] = Vec_IntEntry(p->vPacking, i);
        i--;
        nEntries2++;
        // create edges
        if ( Entry == 2 )
        {
            Count += Gia_ObjEdgeAdd( nNodes[0], nNodes[1], p->vEdge1, p->vEdge2 );
            Count += Gia_ObjEdgeAdd( nNodes[1], nNodes[0], p->vEdge1, p->vEdge2 );
        }
        else if ( Entry == 3 )
        {
            Count += Gia_ObjEdgeAdd( nNodes[0], nNodes[2], p->vEdge1, p->vEdge2 );
            Count += Gia_ObjEdgeAdd( nNodes[2], nNodes[0], p->vEdge1, p->vEdge2 );
            Count += Gia_ObjEdgeAdd( nNodes[1], nNodes[2], p->vEdge1, p->vEdge2 );
            Count += Gia_ObjEdgeAdd( nNodes[2], nNodes[1], p->vEdge1, p->vEdge2 );
        }
    }
    assert( nEntries == nEntries2 );
    if ( Count )
        printf( "Skipped %d illegal edges.\n", Count );
}